

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void * __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::createKey
          (ZoneStringsLoader *this,char *key,UErrorCode *status)

{
  size_t sVar1;
  void *__dest;
  size_t s;
  
  sVar1 = strlen(key);
  s = (long)((sVar1 << 0x20) + 0x100000000) >> 0x20;
  __dest = uprv_malloc_63(s);
  if (__dest == (void *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    __dest = (void *)0x0;
  }
  else {
    memcpy(__dest,key,s);
    *(undefined1 *)((long)__dest + ((long)(sVar1 << 0x20) >> 0x20)) = 0;
  }
  return __dest;
}

Assistant:

void* createKey(const char* key, UErrorCode& status) {
        int32_t len = sizeof(char) * (static_cast<int32_t>(uprv_strlen(key)) + 1);
        char* newKey = (char*) uprv_malloc(len);
        if (newKey == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        uprv_memcpy(newKey, key, len);
        newKey[len-1] = '\0';
        return (void*) newKey;
    }